

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::
Span<QHashPrivate::Node<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>_>::
erase(Span<QHashPrivate::Node<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>_>
      *this,size_t bucket)

{
  byte bVar1;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>::~QHash
            ((QHash<int,_QHash<unsigned_long_long,_QRenderRule>_> *)
             (this->entries[bVar1].storage.data + 8));
  this->entries[bVar1].storage.data[0] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }